

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

uint32 __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetLength
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,uint32 newLen,
          PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  uint32 local_1c;
  PropertyOperationFlags propertyOperationFlags_local;
  uint32 newLen_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  bVar2 = IsLengthWritable(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                ,1000,"(IsLengthWritable())","IsLengthWritable()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar3 = ArrayObject::GetLength((ArrayObject *)arr);
  local_1c = newLen;
  if (newLen < uVar3) {
    local_1c = DeleteDownTo(this,arr,newLen,propertyOperationFlags);
  }
  Js::JavascriptArray::SetLength(&arr->super_JavascriptArray,local_1c);
  return local_1c;
}

Assistant:

uint32 ES5ArrayTypeHandlerBase<T>::SetLength(ES5Array* arr, uint32 newLen, PropertyOperationFlags propertyOperationFlags)
    {
        Assert(IsLengthWritable()); // Should have already checked

        if (newLen < arr->GetLength())
        {
            newLen = DeleteDownTo(arr, newLen, propertyOperationFlags); // Result newLen might be different
        }

        // Trim data items and set length
        arr->SetLength(newLen);

        //
        // Strict mode TODO: In strict mode we may need to throw if we cannot delete to
        // requested newLen (ES5 15.4.5.1 3.l.III.4).
        //
        return newLen;
    }